

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

reentrant_put_transaction<int> * __thiscall
density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
start_reentrant_emplace<int>
          (reentrant_put_transaction<int> *__return_storage_ptr__,
          heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *this)

{
  runtime_type<> *prVar1;
  runtime_type<> rVar2;
  reentrant_put_transaction<int> local_50;
  runtime_type<> *local_38;
  runtime_type<> *type_storage;
  runtime_type<> *type;
  Allocation push_data;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *this_local;
  
  push_data.m_user_storage = this;
  _type = heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
          inplace_allocate<1ul,true,4ul,4ul>
                    ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>
                      *)this);
  type_storage = (runtime_type<> *)0x0;
  prVar1 = type_after_control((ControlBlock *)type);
  local_38 = prVar1;
  rVar2 = runtime_type<>::make<int>();
  prVar1->m_feature_table = rVar2.m_feature_table;
  *(undefined4 *)&(push_data.m_control_block)->m_next = 0;
  type_storage = prVar1;
  reentrant_put_transaction<int>::reentrant_put_transaction(&local_50,0,this,_type);
  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)__return_storage_ptr__,&local_50);
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_50);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = inplace_allocate<
              detail::Queue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            RUNTIME_TYPE * type = nullptr;
            try
            {
                auto const type_storage = type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) RUNTIME_TYPE(RUNTIME_TYPE::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                DENSITY_ASSERT_INTERNAL(
                  (push_data.m_control_block->m_next & (detail::Queue_Busy | detail::Queue_Dead)) ==
                  detail::Queue_Busy);
                push_data.m_control_block->m_next += detail::Queue_Dead - detail::Queue_Busy;
                throw;
            }

            return reentrant_put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }